

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O2

Vec_Int_t * Amap_CreateRulesVector_rec(Amap_Lib_t *p,Vec_Ptr_t *vVecNods,int fXor)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  Vec_Int_t *vNods;
  int *__dest;
  Vec_Ptr_t *vVecNods_00;
  Vec_Ptr_t *vVecNods_01;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  uint i;
  int i_00;
  uint uVar7;
  Vec_Ptr_t *p_00;
  size_t __size;
  
  if (vVecNods->nSize == 1) {
    __size = 0;
    pvVar3 = Vec_PtrEntry(vVecNods,0);
    vNods = (Vec_Int_t *)malloc(0x10);
    iVar6 = *(int *)((long)pvVar3 + 4);
    vNods->nSize = iVar6;
    vNods->nCap = iVar6;
    if ((long)iVar6 == 0) {
      __dest = (int *)0x0;
    }
    else {
      __size = (long)iVar6 << 2;
      __dest = (int *)malloc(__size);
    }
    vNods->pArray = __dest;
    memcpy(__dest,*(void **)((long)pvVar3 + 8),__size);
  }
  else {
    vNods = Vec_IntAlloc(10);
    vVecNods_00 = Vec_PtrAlloc(vVecNods->nSize);
    vVecNods_01 = Vec_PtrAlloc(vVecNods->nSize);
    iVar2 = Amap_CreateCheckAllZero(vVecNods);
    iVar6 = vVecNods->nSize;
    iVar1 = iVar6;
    if (iVar2 == 0) {
      for (uVar7 = 1; (int)uVar7 < (1 << ((byte)iVar6 & 0x1f)) + -2; uVar7 = uVar7 + 1) {
        vVecNods_00->nSize = 0;
        vVecNods_01->nSize = 0;
        i = vVecNods->nSize;
        while (0 < (int)i) {
          i = i - 1;
          pvVar3 = Vec_PtrEntry(vVecNods,i);
          p_00 = vVecNods_01;
          if ((uVar7 >> (i & 0x1f) & 1) == 0) {
            p_00 = vVecNods_00;
          }
          Vec_PtrPush(p_00,pvVar3);
        }
        if (vVecNods_00->nSize < 1) {
          __assert_fail("Vec_PtrSize(vVecNods0) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                        ,0xa4,
                        "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
        }
        if (vVecNods_01->nSize < 1) {
          __assert_fail("Vec_PtrSize(vVecNods1) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                        ,0xa5,
                        "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
        }
        if (vVecNods->nSize <= vVecNods_00->nSize) {
          __assert_fail("Vec_PtrSize(vVecNods0) < Vec_PtrSize(vVecNods)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                        ,0xa6,
                        "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
        }
        if ((uint)vVecNods->nSize <= (uint)vVecNods_01->nSize) {
          __assert_fail("Vec_PtrSize(vVecNods1) < Vec_PtrSize(vVecNods)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                        ,0xa7,
                        "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
        }
        pVVar4 = Amap_CreateRulesVector_rec(p,vVecNods_00,fXor);
        pVVar5 = Amap_CreateRulesVector_rec(p,vVecNods_01,fXor);
        Amap_CreateRulesTwo(p,vNods,pVVar4,pVVar5,fXor);
        Vec_IntFree(pVVar4);
        Vec_IntFree(pVVar5);
      }
    }
    else {
      while (iVar6 = iVar6 + -1, 1 < iVar1) {
        vVecNods_00->nSize = 0;
        vVecNods_01->nSize = 0;
        for (iVar2 = 0; i_00 = iVar1 + -1, iVar6 != iVar2; iVar2 = iVar2 + 1) {
          pvVar3 = Vec_PtrEntry(vVecNods,iVar2);
          Vec_PtrPush(vVecNods_00,pvVar3);
        }
        for (; i_00 < vVecNods->nSize; i_00 = i_00 + 1) {
          pvVar3 = Vec_PtrEntry(vVecNods,i_00);
          Vec_PtrPush(vVecNods_01,pvVar3);
        }
        pVVar4 = Amap_CreateRulesVector_rec(p,vVecNods_00,fXor);
        pVVar5 = Amap_CreateRulesVector_rec(p,vVecNods_01,fXor);
        Amap_CreateRulesTwo(p,vNods,pVVar4,pVVar5,fXor);
        Vec_IntFree(pVVar4);
        Vec_IntFree(pVVar5);
        iVar1 = iVar1 + -1;
      }
    }
    Vec_PtrFree(vVecNods_00);
    Vec_PtrFree(vVecNods_01);
  }
  return vNods;
}

Assistant:

Vec_Int_t * Amap_CreateRulesVector_rec( Amap_Lib_t * p, Vec_Ptr_t * vVecNods, int fXor )
{
    Vec_Ptr_t * vVecNods0, * vVecNods1;
    Vec_Int_t * vRes, * vNods, * vNods0, * vNods1;
    int i, k;
    if ( Vec_PtrSize(vVecNods) == 1 )
        return Vec_IntDup( (Vec_Int_t *)Vec_PtrEntry(vVecNods, 0) );
    vRes = Vec_IntAlloc( 10 );
    vVecNods0 = Vec_PtrAlloc( Vec_PtrSize(vVecNods) );
    vVecNods1 = Vec_PtrAlloc( Vec_PtrSize(vVecNods) );
    if ( Amap_CreateCheckAllZero(vVecNods) )
    {
        for ( i = Vec_PtrSize(vVecNods)-1; i > 0; i-- )
        {
            Vec_PtrClear( vVecNods0 );
            Vec_PtrClear( vVecNods1 );
            Vec_PtrForEachEntryStop( Vec_Int_t *, vVecNods, vNods, k, i )
                Vec_PtrPush( vVecNods0, vNods );
            Vec_PtrForEachEntryStart( Vec_Int_t *, vVecNods, vNods, k, i )
                Vec_PtrPush( vVecNods1, vNods );
            vNods0 = Amap_CreateRulesVector_rec( p, vVecNods0, fXor );
            vNods1 = Amap_CreateRulesVector_rec( p, vVecNods1, fXor );
            Amap_CreateRulesTwo( p, vRes, vNods0, vNods1, fXor );
            Vec_IntFree( vNods0 );
            Vec_IntFree( vNods1 );
        }
    }
    else
    {
        int Limit = (1 << Vec_PtrSize(vVecNods))-2;
        for ( i = 1; i < Limit; i++ )
        {
            Vec_PtrClear( vVecNods0 );
            Vec_PtrClear( vVecNods1 );
            Vec_PtrForEachEntryReverse( Vec_Int_t *, vVecNods, vNods, k )
            {
                if ( i & (1 << k) )
                    Vec_PtrPush( vVecNods1, vNods );
                else
                    Vec_PtrPush( vVecNods0, vNods );
            }
            assert( Vec_PtrSize(vVecNods0) > 0 );
            assert( Vec_PtrSize(vVecNods1) > 0 );
            assert( Vec_PtrSize(vVecNods0) < Vec_PtrSize(vVecNods) );
            assert( Vec_PtrSize(vVecNods1) < Vec_PtrSize(vVecNods) );
            vNods0 = Amap_CreateRulesVector_rec( p, vVecNods0, fXor );
            vNods1 = Amap_CreateRulesVector_rec( p, vVecNods1, fXor );
            Amap_CreateRulesTwo( p, vRes, vNods0, vNods1, fXor );
            Vec_IntFree( vNods0 );
            Vec_IntFree( vNods1 );
        }
    }
    Vec_PtrFree( vVecNods0 );
    Vec_PtrFree( vVecNods1 );
    return vRes;
}